

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
Serializer::report_exception(Serializer *this,long lineNo,string *expression,exception_ptr *e)

{
  undefined8 uVar1;
  int *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  long *plVar2;
  int iVar3;
  undefined1 auVar4 [12];
  exception_ptr eStack_38;
  long local_30;
  char *local_28;
  
  local_30 = lineNo;
  std::__exception_ptr::exception_ptr::exception_ptr(&eStack_38,e);
  auVar4 = std::rethrow_exception((exception_ptr)&eStack_38);
  iVar3 = auVar4._8_4_;
  uVar1 = auVar4._0_8_;
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_38);
  if (iVar3 == 4) {
    t = (int *)__cxa_begin_catch(uVar1);
    kiste::raw::text(&this->super_raw,"Caught an int \'");
    kiste::raw::escape<int_const&>(&this->super_raw,t);
    kiste::raw::text(&this->super_raw,"\'");
    this->caughtInt = true;
  }
  else if (iVar3 == 3) {
    t_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_begin_catch(uVar1);
    kiste::raw::text(&this->super_raw,"Caught a std::string \'");
    kiste::raw::escape<std::__cxx11::string_const&>(&this->super_raw,t_00);
    kiste::raw::text(&this->super_raw,"\'");
    this->caughtString = true;
  }
  else {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    if (iVar3 == 2) {
      kiste::raw::text(&this->super_raw,"Caught a std::exception \'");
      local_28 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
      kiste::raw::escape<char_const*>(&this->super_raw,&local_28);
      kiste::raw::text(&this->super_raw,"\'");
      this->caughtException = true;
    }
    else {
      kiste::raw::text(&this->super_raw,"Caught an unknown exception");
    }
  }
  __cxa_end_catch();
  kiste::raw::text(&this->super_raw," at line ");
  kiste::raw::escape<long&>(&this->super_raw,&local_30);
  kiste::raw::text(&this->super_raw," in expression(");
  kiste::raw::escape<std::__cxx11::string_const&>(&this->super_raw,expression);
  kiste::raw::text(&this->super_raw,")");
  return;
}

Assistant:

void report_exception(long lineNo, const std::string& expression, std::exception_ptr e)
  {
    try
    {
      std::rethrow_exception(e);
    }
    catch (const int& e)
    {
      text("Caught an int '");
      escape(e);
      text("'");
      caughtInt = true;
    }
    catch (const std::string& e)
    {
      text("Caught a std::string '");
      escape(e);
      text("'");
      caughtString = true;
    }
    catch (const std::exception& e)
    {
      text("Caught a std::exception '");
      escape(e.what());
      text("'");
      caughtException = true;
    }
    catch (...)
    {
      text("Caught an unknown exception");
    }
    text(" at line ");
    escape(lineNo);
    text(" in expression(");
    escape(expression);
    text(")");
  }